

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void ibfstages(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  ulong local_108;
  ulong local_100;
  long local_f8;
  float *local_f0;
  float *local_e8;
  float *local_d0;
  float *local_c8;
  long local_c0;
  float *local_b8;
  float *local_b0;
  
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  lVar23 = NDiffU << 4;
  uVar20 = (ulong)(1L << (M & 0x3fU)) >> 3;
  uVar16 = uVar20 / (ulong)NDiffU;
  lVar21 = uVar20 * Ustride;
  local_100 = uVar16 * Ustride;
  local_108 = local_100 * 2;
  pfVar1 = Utbl + (Ustride << ((ulong)(byte)((char)M - 2) & 0x3f));
  lVar22 = NDiffU;
  local_f8 = NDiffU * 2;
  for (; 0 < StageCnt; StageCnt = StageCnt + -1) {
    local_c0 = local_100 * 4;
    fVar2 = *Utbl;
    auVar54 = ZEXT464((uint)fVar2);
    fVar3 = *pfVar1;
    fVar4 = Utbl[lVar21];
    auVar49 = ZEXT1664(ZEXT416((uint)fVar2));
    auVar50 = ZEXT1664(ZEXT416((uint)fVar3));
    auVar53 = ZEXT1664(ZEXT416((uint)fVar2));
    auVar52 = ZEXT1664(ZEXT416((uint)fVar3));
    fVar2 = pfVar1[-lVar21];
    uVar18 = NDiffU / 2;
    uVar20 = NDiffU;
    pfVar24 = Utbl;
    local_f0 = ioptr;
    local_e8 = Utbl;
    local_d0 = pfVar1;
    local_c8 = pfVar1;
    local_b8 = pfVar1;
    local_b0 = Utbl;
    while (uVar20 != 0) {
      uVar15 = *(ulong *)(local_f0 + local_f8);
      fVar5 = *local_f0;
      fVar6 = local_f0[1];
      pfVar19 = local_f0;
      uVar17 = uVar16;
      while( true ) {
        uVar17 = uVar17 - 1;
        fVar7 = pfVar19[local_f8 * 3 + 1];
        auVar37 = auVar54._0_16_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar15;
        auVar25 = vfmadd213ss_avx512f(ZEXT416((uint)fVar3),auVar33,ZEXT416((uint)fVar6));
        auVar26 = vmovshdup_avx512vl(auVar33);
        fVar8 = pfVar19[local_f8 * 2 + 1];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar15;
        auVar27 = vfmadd213ss_avx512f(auVar37,auVar27,ZEXT416((uint)fVar5));
        auVar28 = vaddss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
        fVar5 = pfVar19[lVar22 * 8];
        fVar9 = pfVar19[lVar22 * 8 + 1];
        fVar10 = pfVar19[local_f8 + lVar22 * 8];
        fVar11 = pfVar19[local_f8 + lVar22 * 8 + 1];
        fVar12 = pfVar19[local_f8 * 2 + lVar22 * 8];
        fVar13 = pfVar19[local_f8 * 2 + lVar22 * 8 + 1];
        fVar14 = pfVar19[local_f8 * 3 + lVar22 * 8];
        auVar29 = vfmadd231ss_avx512f(auVar25,auVar37,auVar26);
        auVar25 = vfmsub213ss_avx512f(auVar37,ZEXT416((uint)pfVar19[local_f8 * 3]),
                                      ZEXT416((uint)pfVar19[local_f8 * 2]));
        auVar46 = SUB6416(ZEXT464(0x40000000),0);
        auVar30 = vfmsub213ss_avx512f(ZEXT416((uint)fVar6),auVar46,auVar29);
        auVar31 = vmulss_avx512f(ZEXT416((uint)pfVar19[local_f8 * 3]),ZEXT416((uint)fVar3));
        auVar32 = vaddss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
        auVar36 = ZEXT416((uint)fVar3);
        auVar33 = vfmsub231ss_avx512f(auVar25,ZEXT416((uint)fVar7),auVar36);
        auVar25 = vfmsub213ss_fma(ZEXT416((uint)pfVar19[local_f8 * 2]),auVar46,auVar33);
        auVar43 = auVar50._0_16_;
        auVar34 = vmulss_avx512f(auVar33,auVar43);
        auVar42 = auVar49._0_16_;
        auVar33 = vfnmadd213ss_fma(auVar33,auVar42,auVar30);
        auVar35 = vmulss_avx512f(auVar25,auVar42);
        auVar25 = vfmadd213ss_avx512f(auVar25,auVar43,auVar29);
        auVar29 = vaddss_avx512f(auVar29,auVar29);
        auVar39 = ZEXT416((uint)fVar3);
        auVar38 = ZEXT416((uint)pfVar19[local_f8 * 3 + lVar22 * 8 + 1]);
        auVar51 = auVar52._0_16_;
        auVar45 = auVar53._0_16_;
        if (uVar17 == 0) break;
        auVar26 = vfnmadd231ss_avx512f(auVar27,auVar39,auVar26);
        auVar27 = vfnmsub213ss_avx512f(ZEXT416((uint)fVar7),auVar37,auVar31);
        auVar28 = vsubss_avx512f(auVar28,auVar26);
        auVar27 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar27);
        auVar31 = vaddss_avx512f(auVar35,auVar26);
        auVar34 = vaddss_avx512f(auVar34,auVar28);
        auVar32 = vsubss_avx512f(auVar32,auVar27);
        auVar35 = vfmadd231ss_avx512f(auVar33,auVar43,auVar27);
        auVar27 = vfmadd231ss_avx512f(auVar34,auVar27,auVar42);
        auVar34 = vfmadd213ss_avx512f(auVar37,ZEXT416((uint)fVar10),ZEXT416((uint)fVar5));
        auVar33 = vfmadd213ss_fma(ZEXT416((uint)fVar10),auVar39,ZEXT416((uint)fVar9));
        auVar31 = vfnmadd231ss_avx512f(auVar31,auVar43,auVar32);
        auVar32 = vfmadd231ss_avx512f(auVar25,auVar42,auVar32);
        auVar25 = vfmsub213ss_fma(auVar30,auVar46,auVar35);
        auVar30 = vfnmadd231ss_avx512f(auVar34,auVar39,ZEXT416((uint)fVar11));
        auVar34 = vfmadd231ss_avx512f(auVar33,auVar37,ZEXT416((uint)fVar11));
        auVar33 = vfmsub213ss_avx512f(auVar37,ZEXT416((uint)fVar14),ZEXT416((uint)fVar12));
        auVar28 = vfmsub213ss_avx512f(auVar28,auVar46,auVar27);
        auVar26 = vfmsub213ss_avx512f(auVar26,auVar46,auVar31);
        auVar29 = vsubss_avx512f(auVar29,auVar32);
        auVar36 = vfmsub231ss_avx512f(auVar33,auVar38,auVar39);
        auVar37 = vmulss_avx512f(auVar37,auVar38);
        auVar38 = vfmsub213ss_avx512f(ZEXT416((uint)fVar5),auVar46,auVar30);
        auVar33 = vfmsub213ss_fma(ZEXT416((uint)fVar9),auVar46,auVar34);
        auVar39 = vfnmsub231ss_avx512f(auVar37,auVar39,ZEXT416((uint)fVar14));
        auVar37 = vfmsub213ss_avx512f(ZEXT416((uint)fVar12),auVar46,auVar36);
        auVar39 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar39);
        auVar40 = vfmadd213ss_avx512f(auVar42,auVar37,auVar30);
        auVar37 = vfmadd213ss_avx512f(auVar37,auVar43,auVar34);
        auVar41 = vfmsub213ss_avx512f(ZEXT416((uint)fVar13),auVar46,auVar39);
        auVar40 = vfnmadd231ss_avx512f(auVar40,auVar43,auVar41);
        auVar37 = vfmadd231ss_avx512f(auVar37,auVar42,auVar41);
        auVar41 = vfmadd213ss_avx512f(auVar43,auVar36,auVar38);
        auVar36 = vfmsub213ss_avx512f(auVar36,auVar42,auVar33);
        auVar42 = vfmadd231ss_avx512f(auVar41,auVar39,auVar42);
        auVar36 = vfmsub231ss_avx512f(auVar36,auVar43,auVar39);
        auVar39 = vfmsub213ss_avx512f(auVar45,auVar40,auVar31);
        auVar30 = vfmsub213ss_avx512f(auVar30,auVar46,auVar40);
        auVar43 = vmulss_avx512f(auVar51,auVar40);
        auVar34 = vfmsub213ss_avx512f(auVar34,auVar46,auVar37);
        auVar43 = vfnmsub231ss_avx512f(auVar43,auVar45,auVar37);
        auVar38 = vfmsub213ss_avx512f(auVar38,auVar46,auVar42);
        auVar33 = vfmsub213ss_avx512f(auVar33,auVar46,auVar36);
        auVar39 = vfmsub231ss_avx512f(auVar39,auVar37,auVar51);
        auVar43 = vaddss_avx512f(auVar32,auVar43);
        auVar37 = vfmsub213ss_avx512f(ZEXT416((uint)fVar4),auVar38,auVar28);
        auVar38 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar38);
        auVar31 = vfmsub213ss_avx512f(auVar31,auVar46,auVar39);
        pfVar19[lVar22 * 8] = auVar39._0_4_;
        auVar32 = vfmsub213ss_avx512f(auVar32,auVar46,auVar43);
        pfVar19[lVar22 * 8 + 1] = auVar43._0_4_;
        auVar39 = vfnmsub231ss_avx512f(auVar38,ZEXT416((uint)fVar4),auVar33);
        auVar33 = vfmsub231ss_avx512f(auVar37,auVar33,ZEXT416((uint)fVar2));
        *pfVar19 = auVar31._0_4_;
        pfVar19[1] = auVar32._0_4_;
        auVar31 = vaddss_avx512f(auVar25,auVar39);
        fVar5 = pfVar19[lVar23];
        fVar6 = pfVar19[lVar23 + 1];
        auVar28 = vfmsub213ss_avx512f(auVar28,auVar46,auVar33);
        pfVar19[local_f8 + lVar22 * 8] = auVar33._0_4_;
        auVar25 = vfmsub213ss_avx512f(auVar25,auVar46,auVar31);
        pfVar19[local_f8 + lVar22 * 8 + 1] = auVar31._0_4_;
        pfVar19[local_f8] = auVar28._0_4_;
        pfVar19[local_f8 + 1] = auVar25._0_4_;
        auVar25 = vmulss_avx512f(auVar51,auVar30);
        auVar33 = vfmadd213ss_avx512f(auVar30,auVar45,auVar29);
        uVar15 = *(ulong *)(pfVar19 + local_f8 + lVar23);
        auVar25 = vfnmsub231ss_fma(auVar25,auVar34,auVar45);
        auVar33 = vfnmadd231ss_avx512f(auVar33,auVar51,auVar34);
        auVar28 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar42);
        auVar30 = vfmadd213ss_avx512f(auVar42,ZEXT416((uint)fVar4),auVar35);
        auVar28 = vfnmsub231ss_avx512f(auVar28,auVar36,ZEXT416((uint)fVar4));
        fVar7 = auVar26._0_4_ + auVar25._0_4_;
        auVar30 = vfnmadd231ss_avx512f(auVar30,ZEXT416((uint)fVar2),auVar36);
        auVar29 = vfmsub213ss_avx512f(auVar29,auVar46,auVar33);
        auVar25 = vfmsub213ss_fma(auVar26,auVar46,ZEXT416((uint)fVar7));
        pfVar19[local_f8 * 2] = fVar7;
        pfVar19[local_f8 * 2 + 1] = auVar33._0_4_;
        auVar33 = vaddss_avx512f(auVar27,auVar28);
        auVar26 = vfmsub213ss_avx512f(auVar35,auVar46,auVar30);
        auVar27 = vfmsub213ss_avx512f(auVar27,auVar46,auVar33);
        pfVar19[local_f8 * 2 + lVar22 * 8] = auVar25._0_4_;
        pfVar19[local_f8 * 2 + lVar22 * 8 + 1] = auVar29._0_4_;
        pfVar19[local_f8 * 3] = auVar33._0_4_;
        pfVar19[local_f8 * 3 + 1] = auVar30._0_4_;
        pfVar19[local_f8 * 3 + lVar22 * 8] = auVar27._0_4_;
        pfVar19[local_f8 * 3 + lVar22 * 8 + 1] = auVar26._0_4_;
        pfVar19 = pfVar19 + lVar23;
      }
      auVar27 = vfnmadd231ss_avx512f(auVar27,auVar26,auVar36);
      auVar26 = vfnmsub213ss_avx512f(ZEXT416((uint)fVar7),auVar37,auVar31);
      auVar31 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar26);
      auVar28 = vsubss_avx512f(auVar28,auVar27);
      auVar35 = vaddss_avx512f(auVar35,auVar27);
      auVar32 = vsubss_avx512f(auVar32,auVar31);
      auVar34 = vaddss_avx512f(auVar34,auVar28);
      auVar40 = vfmadd213ss_avx512f(auVar37,ZEXT416((uint)fVar10),ZEXT416((uint)fVar5));
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar10),auVar36,ZEXT416((uint)fVar9));
      auVar33 = vfmadd231ss_avx512f(auVar33,auVar43,auVar31);
      if (uVar20 == uVar18) {
        local_c0 = -local_c0;
      }
      auVar41 = vfmadd231ss_avx512f(auVar25,auVar42,auVar32);
      auVar32 = vfnmadd231ss_avx512f(auVar35,auVar32,auVar43);
      auVar31 = vfmadd231ss_avx512f(auVar34,auVar31,auVar42);
      local_f0 = local_f0 + 2;
      auVar34 = vfnmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar11),auVar36);
      auVar35 = vfmadd231ss_avx512f(auVar26,auVar37,ZEXT416((uint)fVar11));
      auVar26 = vmulss_avx512f(auVar38,auVar37);
      auVar36 = vfmsub213ss_avx512f(auVar37,ZEXT416((uint)fVar14),ZEXT416((uint)fVar12));
      auVar25 = vfmsub213ss_fma(auVar30,auVar46,auVar33);
      local_b8 = local_b8 + -local_c0;
      auVar30 = vfnmsub231ss_avx512f(auVar26,ZEXT416((uint)fVar14),auVar39);
      auVar29 = vsubss_avx512f(auVar29,auVar41);
      auVar37 = vfmsub213ss_avx512f(auVar27,auVar46,auVar32);
      auVar28 = vfmsub213ss_avx512f(auVar28,auVar46,auVar31);
      auVar27 = vfmsub231ss_avx512f(auVar36,auVar38,auVar39);
      auVar36 = vfmsub213ss_avx512f(ZEXT416((uint)fVar5),auVar46,auVar34);
      auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar9),auVar46,auVar35);
      pfVar24 = pfVar24 + local_108;
      auVar30 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar30);
      local_b0 = local_b0 + local_c0;
      auVar39 = vfmsub213ss_avx512f(ZEXT416((uint)fVar12),auVar46,auVar27);
      auVar38 = vfmsub213ss_avx512f(ZEXT416((uint)fVar13),auVar46,auVar30);
      local_c8 = local_c8 + -local_108;
      auVar40 = vfmadd213ss_avx512f(auVar42,auVar39,auVar34);
      auVar39 = vfmadd213ss_avx512f(auVar39,auVar43,auVar35);
      local_e8 = local_e8 + local_100;
      auVar40 = vfnmadd231ss_avx512f(auVar40,auVar38,auVar43);
      auVar39 = vfmadd231ss_avx512f(auVar39,auVar42,auVar38);
      auVar38 = vfmadd213ss_avx512f(auVar43,auVar27,auVar36);
      auVar27 = vfmsub213ss_fma(auVar27,auVar42,auVar26);
      auVar34 = vfmsub213ss_avx512f(auVar34,auVar46,auVar40);
      auVar35 = vfmsub213ss_avx512f(auVar35,auVar46,auVar39);
      auVar44 = vmulss_avx512f(auVar40,auVar51);
      auVar42 = vfmadd231ss_avx512f(auVar38,auVar30,auVar42);
      auVar27 = vfmsub231ss_fma(auVar27,auVar30,auVar43);
      auVar49 = ZEXT464((uint)*pfVar24);
      auVar50 = ZEXT464((uint)*local_c8);
      local_d0 = local_d0 + -local_100;
      auVar30 = vfnmsub231ss_avx512f(auVar44,auVar45,auVar39);
      auVar43 = vmulss_avx512f(auVar34,auVar51);
      auVar34 = vfmadd213ss_avx512f(auVar34,auVar45,auVar29);
      auVar36 = vfmsub213ss_avx512f(auVar36,auVar46,auVar42);
      auVar26 = vfmsub213ss_fma(auVar26,auVar46,auVar27);
      auVar48 = ZEXT416((uint)fVar2);
      auVar38 = vmulss_avx512f(auVar42,auVar48);
      auVar44 = ZEXT416((uint)fVar4);
      auVar42 = vfmadd213ss_avx512f(auVar42,auVar44,auVar33);
      auVar43 = vfnmsub231ss_avx512f(auVar43,auVar35,auVar45);
      auVar45 = vfmsub213ss_avx512f(auVar45,auVar40,auVar32);
      fVar3 = *local_b8;
      auVar38 = vfnmsub231ss_avx512f(auVar38,auVar27,auVar44);
      auVar34 = vfnmadd231ss_avx512f(auVar34,auVar51,auVar35);
      auVar35 = vfnmadd231ss_avx512f(auVar42,auVar48,auVar27);
      auVar27 = vxorps_avx512vl(ZEXT416((uint)*local_b0),auVar47);
      auVar54 = ZEXT1664(CONCAT124(auVar27._4_12_,
                                   (uint)(uVar18 < uVar20) * (int)*local_b0 +
                                   (uint)(uVar18 >= uVar20) * auVar27._0_4_));
      auVar27 = vfmsub231ss_avx512f(auVar45,auVar39,auVar51);
      auVar39 = vaddss_avx512f(auVar37,auVar43);
      auVar30 = vaddss_avx512f(auVar41,auVar30);
      auVar29 = vfmsub213ss_avx512f(auVar29,auVar46,auVar34);
      auVar42 = vfmsub213ss_avx512f(auVar33,auVar46,auVar35);
      auVar33 = vfmsub213ss_avx512f(auVar37,auVar46,auVar39);
      auVar43 = vfmsub213ss_avx512f(auVar41,auVar46,auVar30);
      auVar32 = vfmsub213ss_avx512f(auVar32,auVar46,auVar27);
      pfVar19[lVar22 * 8] = auVar27._0_4_;
      pfVar19[local_f8 * 2] = auVar39._0_4_;
      pfVar19[lVar22 * 8 + 1] = auVar30._0_4_;
      pfVar19[local_f8 * 2 + 1] = auVar34._0_4_;
      auVar53 = ZEXT464((uint)*local_e8);
      auVar52 = ZEXT464((uint)*local_d0);
      *pfVar19 = auVar32._0_4_;
      pfVar19[local_f8 * 2 + lVar22 * 8] = auVar33._0_4_;
      auVar33 = vmulss_avx512f(auVar36,auVar48);
      pfVar19[1] = auVar43._0_4_;
      pfVar19[local_f8 * 2 + lVar22 * 8 + 1] = auVar29._0_4_;
      auVar27 = vfnmsub231ss_fma(auVar33,auVar44,auVar26);
      auVar33 = vfmsub213ss_avx512f(auVar44,auVar36,auVar28);
      auVar33 = vfmsub231ss_fma(auVar33,auVar26,auVar48);
      fVar2 = auVar25._0_4_ + auVar27._0_4_;
      auVar26 = vaddss_avx512f(auVar31,auVar38);
      auVar25 = vfmsub213ss_fma(auVar25,auVar46,ZEXT416((uint)fVar2));
      auVar27 = vfmsub213ss_avx512f(auVar31,auVar46,auVar26);
      pfVar19[local_f8 + lVar22 * 8] = auVar33._0_4_;
      pfVar19[local_f8 * 3] = auVar26._0_4_;
      pfVar19[local_f8 + lVar22 * 8 + 1] = fVar2;
      pfVar19[local_f8 * 3 + 1] = auVar35._0_4_;
      auVar33 = vfmsub213ss_avx512f(auVar28,auVar46,auVar33);
      fVar4 = local_e8[lVar21];
      fVar2 = local_d0[-lVar21];
      pfVar19[local_f8] = auVar33._0_4_;
      pfVar19[local_f8 * 3 + lVar22 * 8] = auVar27._0_4_;
      pfVar19[local_f8 + 1] = auVar25._0_4_;
      pfVar19[local_f8 * 3 + lVar22 * 8 + 1] = auVar42._0_4_;
      uVar20 = uVar20 - 1;
    }
    local_100 = local_100 >> 3;
    local_108 = local_108 >> 3;
    uVar16 = uVar16 >> 3;
    NDiffU = NDiffU << 3;
    lVar23 = lVar23 << 3;
    lVar22 = lVar22 * 8;
    local_f8 = local_f8 * 8;
  }
  return;
}

Assistant:

static inline void ibfstages(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt){
/***   RADIX 8 Stages	***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	Uinc;
unsigned long 	Uinc2;
unsigned long 	Uinc4;
unsigned long 	DiffUCnt;
unsigned long 	SameUCnt;
unsigned long 	U2toU3;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;
float 	*u0r, *u0i, *u1r, *u1i, *u2r, *u2i;

float w0r, w0i, w1r, w1i, w2r, w2i, w3r, w3i;
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 8;
pos = pinc * 4;
posi =  pos + 1;
NSameU = POW2(M) / 8 /NDiffU;	// 8 pts per butterfly
Uinc = NSameU * Ustride;
Uinc2 = Uinc * 2;
Uinc4 = Uinc * 4;
U2toU3 = (POW2(M) / 8)*Ustride;
for (; StageCnt > 0 ; StageCnt--){

	u0r = &Utbl[0];
	u0i = &Utbl[POW2(M-2)*Ustride];
	u1r = u0r;
	u1i = u0i;
	u2r = u0r;
	u2i = u0i;

	w0r =  *u0r;
	w0i =  *u0i;
	w1r =  *u1r;
	w1i =  *u1i;
	w2r =  *u2r;
	w2i =  *u2i;
	w3r =  *(u2r+U2toU3);
	w3i =  *(u2i-U2toU3);

	pstrt = ioptr;

	p0r = pstrt;
	p1r = pstrt+pinc;
	p2r = p1r+pinc;
	p3r = p2r+pinc;

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1	- w0-	f1	-	-	f1	-	-	f1
			f2	-	-	f2	- w1-	f2	-	-	f4
			f3	- w0-	t1	- iw1-	f3	-	-	f5

			f4	-	-	t0	-	-	f4	- w2-	t0
			f5	- w0-	f5	-	-	f5	- w3-	t1
			f6	-	-	f6	- w1-	f6	- iw2-	f6
			f7	- w0-	t1	- iw1-	f7	- iw3-	f7
			*/

	for (DiffUCnt = NDiffU; DiffUCnt > 0 ; DiffUCnt--){
		f0r = *p0r;
		f0i = *(p0r + 1);
		f1r = *p1r;
		f1i = *(p1r + 1);
		for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){
			f2r = *p2r;
			f2i = *(p2r + 1);
			f3r = *p3r;
			f3i = *(p3r + 1);

			t0r = f0r + f1r * w0r - f1i * w0i;
			t0i = f0i + f1r * w0i + f1i * w0r;
			f1r = f0r * Two - t0r;
			f1i = f0i * Two - t0i;

			f4r = *(p0r + pos);
			f4i = *(p0r + posi);
			f5r = *(p1r + pos);
			f5i = *(p1r + posi);

			f6r = *(p2r + pos);
			f6i = *(p2r + posi);
			f7r = *(p3r + pos);
			f7i = *(p3r + posi);

			t1r = f2r - f3r * w0r + f3i * w0i;
			t1i = f2i - f3r * w0i - f3i * w0r;
			f2r = f2r * Two - t1r;
			f2i = f2i * Two - t1i;

			f0r = t0r + f2r * w1r - f2i * w1i;
			f0i = t0i + f2r * w1i + f2i * w1r;
			f2r = t0r * Two - f0r;
			f2i = t0i * Two - f0i;

			f3r = f1r + t1r * w1i + t1i * w1r;
			f3i = f1i - t1r * w1r + t1i * w1i;
			f1r = f1r * Two - f3r;
			f1i = f1i * Two - f3i;


			t0r = f4r + f5r * w0r - f5i * w0i;
			t0i = f4i + f5r * w0i + f5i * w0r;
			f5r = f4r * Two - t0r;
			f5i = f4i * Two - t0i;

			t1r = f6r - f7r * w0r + f7i * w0i;
			t1i = f6i - f7r * w0i - f7i * w0r;
			f6r = f6r * Two - t1r;
			f6i = f6i * Two - t1i;

			f4r = t0r + f6r * w1r - f6i * w1i;
			f4i = t0i + f6r * w1i + f6i * w1r;
			f6r = t0r * Two - f4r;
			f6i = t0i * Two - f4i;

			f7r = f5r + t1r * w1i + t1i * w1r;
			f7i = f5i - t1r * w1r + t1i * w1i;
			f5r = f5r * Two - f7r;
			f5i = f5i * Two - f7i;

			t0r = f0r - f4r * w2r + f4i * w2i;
			t0i = f0i - f4r * w2i - f4i * w2r;
			f0r = f0r * Two - t0r;
			f0i = f0i * Two - t0i;

			t1r = f1r - f5r * w3r + f5i * w3i;
			t1i = f1i - f5r * w3i - f5i * w3r;
			f1r = f1r * Two - t1r;
			f1i = f1i * Two - t1i;

			*(p0r + pos) = t0r;
			*(p0r + posi) = t0i;
			*p0r = f0r;
			*(p0r + 1) = f0i;

			p0r += pnext;
			f0r = *p0r;
			f0i = *(p0r + 1);

			*(p1r + pos) = t1r;
			*(p1r + posi) = t1i;
			*p1r = f1r;
			*(p1r + 1) = f1i;

			p1r += pnext;

			f1r = *p1r;
			f1i = *(p1r + 1);

			f4r = f2r - f6r * w2i - f6i * w2r;
			f4i = f2i + f6r * w2r - f6i * w2i;
			f6r = f2r * Two - f4r;
			f6i = f2i * Two - f4i;

			f5r = f3r - f7r * w3i - f7i * w3r;
			f5i = f3i + f7r * w3r - f7i * w3i;
			f7r = f3r * Two - f5r;
			f7i = f3i * Two - f5i;

			*p2r = f4r;
			*(p2r + 1) = f4i;
			*(p2r + pos) = f6r;
			*(p2r + posi) = f6i;

			p2r += pnext;

			*p3r = f5r;
			*(p3r + 1) = f5i;
			*(p3r + pos) = f7r;
			*(p3r + posi) = f7i;

			p3r += pnext;

		}
		
		f2r = *p2r;
		f2i = *(p2r + 1);
		f3r = *p3r;
		f3i = *(p3r + 1);

		t0r = f0r + f1r * w0r - f1i * w0i;
		t0i = f0i + f1r * w0i + f1i * w0r;
		f1r = f0r * Two - t0r;
		f1i = f0i * Two - t0i;

		f4r = *(p0r + pos);
		f4i = *(p0r + posi);
		f5r = *(p1r + pos);
		f5i = *(p1r + posi);

		f6r = *(p2r + pos);
		f6i = *(p2r + posi);
		f7r = *(p3r + pos);
		f7i = *(p3r + posi);

		t1r = f2r - f3r * w0r + f3i * w0i;
		t1i = f2i - f3r * w0i - f3i * w0r;
		f2r = f2r * Two - t1r;
		f2i = f2i * Two - t1i;

		f0r = t0r + f2r * w1r - f2i * w1i;
		f0i = t0i + f2r * w1i + f2i * w1r;
		f2r = t0r * Two - f0r;
		f2i = t0i * Two - f0i;

		f3r = f1r + t1r * w1i + t1i * w1r;
		f3i = f1i - t1r * w1r + t1i * w1i;
		f1r = f1r * Two - f3r;
		f1i = f1i * Two - f3i;

		if (DiffUCnt == NDiffU/2)
			Uinc4 = -Uinc4;

		u0r += Uinc4;
		u0i -= Uinc4;
		u1r += Uinc2;
		u1i -= Uinc2;
		u2r += Uinc;
		u2i -= Uinc;

		pstrt += 2;

		t0r = f4r + f5r * w0r - f5i * w0i;
		t0i = f4i + f5r * w0i + f5i * w0r;
		f5r = f4r * Two - t0r;
		f5i = f4i * Two - t0i;

		t1r = f6r - f7r * w0r + f7i * w0i;
		t1i = f6i - f7r * w0i - f7i * w0r;
		f6r = f6r * Two - t1r;
		f6i = f6i * Two - t1i;

		f4r = t0r + f6r * w1r - f6i * w1i;
		f4i = t0i + f6r * w1i + f6i * w1r;
		f6r = t0r * Two - f4r;
		f6i = t0i * Two - f4i;

		f7r = f5r + t1r * w1i + t1i * w1r;
		f7i = f5i - t1r * w1r + t1i * w1i;
		f5r = f5r * Two - f7r;
		f5i = f5i * Two - f7i;

		w0r = *u0r;
		w0i =  *u0i;
		w1r =  *u1r;
		w1i =  *u1i;

		if (DiffUCnt <= NDiffU/2)
			w0r = -w0r;

		t0r = f0r - f4r * w2r + f4i * w2i;
		t0i = f0i - f4r * w2i - f4i * w2r;
		f0r = f0r * Two - t0r;
		f0i = f0i * Two - t0i;

		f4r = f2r - f6r * w2i - f6i * w2r;
		f4i = f2i + f6r * w2r - f6i * w2i;
		f6r = f2r * Two - f4r;
		f6i = f2i * Two - f4i;

		*(p0r + pos) = t0r;
		*p2r = f4r;
		*(p0r + posi) = t0i;
		*(p2r + 1) = f4i;
		w2r =  *u2r;
		w2i =  *u2i;
		*p0r = f0r;
		*(p2r + pos) = f6r;
		*(p0r + 1) = f0i;
		*(p2r + posi) = f6i;

		p0r = pstrt;
		p2r = pstrt + pinc + pinc;	

		t1r = f1r - f5r * w3r + f5i * w3i;
		t1i = f1i - f5r * w3i - f5i * w3r;
		f1r = f1r * Two - t1r;
		f1i = f1i * Two - t1i;

		f5r = f3r - f7r * w3i - f7i * w3r;
		f5i = f3i + f7r * w3r - f7i * w3i;
		f7r = f3r * Two - f5r;
		f7i = f3i * Two - f5i;

		*(p1r + pos) = t1r;
		*p3r = f5r;
		*(p1r + posi) = t1i;
		*(p3r + 1) = f5i;
		w3r =  *(u2r+U2toU3);
		w3i =  *(u2i-U2toU3);
		*p1r = f1r;
		*(p3r + pos) = f7r;
		*(p1r + 1) = f1i;
		*(p3r + posi) = f7i;

		p1r = pstrt + pinc;
		p3r = p2r + pinc;	
	}
	NSameU /= 8;
	Uinc /= 8;
	Uinc2 /= 8;
	Uinc4 = Uinc * 4;
	NDiffU *= 8;
	pinc *= 8;
	pnext *= 8;
	pos *= 8;
	posi =  pos + 1;
}
}